

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

SynNew * ParseNew(ParseContext *ctx)

{
  Lexeme *begin;
  IntrusiveList<SynBase> constructor_00;
  IntrusiveList<SynBase> constructor_01;
  IntrusiveList<SynCallArgument> arguments_00;
  IntrusiveList<SynCallArgument> arguments_01;
  bool bVar1;
  bool bVar2;
  Lexeme *pLVar3;
  Lexeme *pLVar4;
  SynTypeArray *pSVar5;
  SynNew *this;
  IntrusiveList<SynCallArgument> IVar6;
  IntrusiveList<SynBase> IVar7;
  SynBase *local_d0;
  SynBase *local_c8;
  SynCallArgument *local_c0;
  SynCallArgument *local_b8;
  SynBase *local_90;
  SynBase *count_1;
  SynBase *prevSize;
  SynTypeArray *arrayType;
  SynBase *local_58;
  SynBase *count;
  IntrusiveList<SynBase> constructor;
  IntrusiveList<SynCallArgument> arguments;
  SynBase *pSStack_28;
  bool explicitType;
  SynBase *type;
  Lexeme *start;
  ParseContext *ctx_local;
  
  begin = ctx->currentLexeme;
  bVar1 = ParseContext::Consume(ctx,lex_new);
  if (bVar1) {
    bVar1 = ParseContext::Consume(ctx,lex_oparen);
    if (bVar1) {
      pSStack_28 = ParseType(ctx,(bool *)0x0,false);
      if (pSStack_28 == (SynBase *)0x0) {
        pLVar3 = ParseContext::Current(ctx);
        anon_unknown.dwarf_11716f::Report(ctx,pLVar3,"ERROR: type name expected after \'new\'");
        pSStack_28 = &ParseContext::get<SynError>(ctx)->super_SynBase;
        pLVar3 = ParseContext::Current(ctx);
        pLVar4 = ParseContext::Current(ctx);
        SynError::SynError((SynError *)pSStack_28,pLVar3,pLVar4);
      }
      anon_unknown.dwarf_11716f::CheckConsume
                (ctx,lex_cparen,"ERROR: matching \')\' not found after \'(\'");
    }
    else {
      pSStack_28 = ParseType(ctx,(bool *)0x0,true);
      if (pSStack_28 == (SynBase *)0x0) {
        pLVar3 = ParseContext::Current(ctx);
        anon_unknown.dwarf_11716f::Report(ctx,pLVar3,"ERROR: type name expected after \'new\'");
        pSStack_28 = &ParseContext::get<SynError>(ctx)->super_SynBase;
        pLVar3 = ParseContext::Current(ctx);
        pLVar4 = ParseContext::Current(ctx);
        SynError::SynError((SynError *)pSStack_28,pLVar3,pLVar4);
      }
    }
    IntrusiveList<SynCallArgument>::IntrusiveList
              ((IntrusiveList<SynCallArgument> *)&constructor.tail);
    IntrusiveList<SynBase>::IntrusiveList((IntrusiveList<SynBase> *)&count);
    bVar2 = ParseContext::Consume(ctx,lex_obracket);
    if (bVar2) {
      local_58 = ParseTernaryExpr(ctx);
      if (local_58 == (SynBase *)0x0) {
        pLVar3 = ParseContext::Current(ctx);
        anon_unknown.dwarf_11716f::Report(ctx,pLVar3,"ERROR: expression not found after \'[\'");
        local_58 = &ParseContext::get<SynError>(ctx)->super_SynBase;
        pLVar3 = ParseContext::Current(ctx);
        pLVar4 = ParseContext::Current(ctx);
        SynError::SynError((SynError *)local_58,pLVar3,pLVar4);
      }
      anon_unknown.dwarf_11716f::CheckConsume
                (ctx,lex_cbracket,"ERROR: \']\' not found after expression");
      ctx_local = (ParseContext *)ParseContext::get<SynNew>(ctx);
      pLVar3 = ParseContext::Previous(ctx);
      IVar6.tail = arguments.head;
      IVar6.head = (SynCallArgument *)constructor.tail;
      IVar7.tail = constructor.head;
      IVar7.head = count;
      SynNew::SynNew((SynNew *)ctx_local,begin,pLVar3,pSStack_28,IVar6,local_58,IVar7);
    }
    else {
      if ((!bVar1) && (bVar1 = isType<SynTypeArray>(pSStack_28), bVar1)) {
        pSVar5 = getType<SynTypeArray>(pSStack_28);
        count_1 = (SynBase *)0x0;
        for (local_90 = (pSVar5->sizes).head; local_90->next != (SynBase *)0x0;
            local_90 = local_90->next) {
          count_1 = local_90;
        }
        bVar1 = isType<SynNothing>(local_90);
        if (!bVar1) {
          if (count_1 == (SynBase *)0x0) {
            pSStack_28 = pSVar5->type;
          }
          else {
            count_1->next = (SynBase *)0x0;
          }
          this = ParseContext::get<SynNew>(ctx);
          pLVar3 = ParseContext::Previous(ctx);
          arguments_01.tail = arguments.head;
          arguments_01.head = (SynCallArgument *)constructor.tail;
          constructor_00.tail = constructor.head;
          constructor_00.head = count;
          SynNew::SynNew(this,begin,pLVar3,pSStack_28,arguments_01,local_90,constructor_00);
          return this;
        }
      }
      bVar1 = ParseContext::Consume(ctx,lex_oparen);
      if (bVar1) {
        IVar6 = ParseCallArguments(ctx);
        local_c0 = IVar6.head;
        constructor.tail = &local_c0->super_SynBase;
        local_b8 = IVar6.tail;
        arguments.head = local_b8;
        anon_unknown.dwarf_11716f::CheckConsume
                  (ctx,lex_cparen,"ERROR: \')\' not found after function argument list");
      }
      bVar1 = ParseContext::Consume(ctx,lex_ofigure);
      if (bVar1) {
        IVar7 = ParseExpressions(ctx);
        local_d0 = IVar7.head;
        count = local_d0;
        local_c8 = IVar7.tail;
        constructor.head = local_c8;
        anon_unknown.dwarf_11716f::CheckConsume
                  (ctx,lex_cfigure,"ERROR: \'}\' not found after custom constructor body");
      }
      ctx_local = (ParseContext *)ParseContext::get<SynNew>(ctx);
      pLVar3 = ParseContext::Previous(ctx);
      arguments_00.tail = arguments.head;
      arguments_00.head = (SynCallArgument *)constructor.tail;
      constructor_01.tail = constructor.head;
      constructor_01.head = count;
      SynNew::SynNew((SynNew *)ctx_local,begin,pLVar3,pSStack_28,arguments_00,(SynBase *)0x0,
                     constructor_01);
    }
  }
  else {
    ctx_local = (ParseContext *)0x0;
  }
  return (SynNew *)ctx_local;
}

Assistant:

SynNew* ParseNew(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_new))
	{
		SynBase *type = NULL;

		bool explicitType = ctx.Consume(lex_oparen);

		if(explicitType)
		{
			type = ParseType(ctx);

			if(!type)
			{
				Report(ctx, ctx.Current(), "ERROR: type name expected after 'new'");

				type = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
			}

			CheckConsume(ctx, lex_cparen, "ERROR: matching ')' not found after '('");
		}
		else
		{
			type = ParseType(ctx, NULL, true);

			if(!type)
			{
				Report(ctx, ctx.Current(), "ERROR: type name expected after 'new'");

				type = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
			}
		}

		IntrusiveList<SynCallArgument> arguments;

		IntrusiveList<SynBase> constructor;

		if(ctx.Consume(lex_obracket))
		{
			SynBase *count = ParseTernaryExpr(ctx);

			if(!count)
			{
				Report(ctx, ctx.Current(), "ERROR: expression not found after '['");

				count = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
			}

			CheckConsume(ctx, lex_cbracket, "ERROR: ']' not found after expression");

			return new (ctx.get<SynNew>()) SynNew(start, ctx.Previous(), type, arguments, count, constructor);
		}
		else if(!explicitType && isType<SynTypeArray>(type))
		{
			SynTypeArray *arrayType = getType<SynTypeArray>(type);

			// Try to extract last array type extent as a size
			SynBase *prevSize = NULL;
			SynBase *count = arrayType->sizes.head;

			while(count->next)
			{
				prevSize = count;
				count = count->next;
			}

			// Check if the extent is real
			if(!isType<SynNothing>(count))
			{
				if(prevSize)
					prevSize->next = NULL;
				else
					type = arrayType->type;

				return new (ctx.get<SynNew>()) SynNew(start, ctx.Previous(), type, arguments, count, constructor);
			}
		}

		if(ctx.Consume(lex_oparen))
		{
			arguments = ParseCallArguments(ctx);

			CheckConsume(ctx, lex_cparen, "ERROR: ')' not found after function argument list");
		}

		if(ctx.Consume(lex_ofigure))
		{
			constructor = ParseExpressions(ctx);

			CheckConsume(ctx, lex_cfigure, "ERROR: '}' not found after custom constructor body");
		}

		return new (ctx.get<SynNew>()) SynNew(start, ctx.Previous(), type, arguments, NULL, constructor);
	}

	return NULL;
}